

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.cpp
# Opt level: O3

void __thiscall ByteArray::grow(ByteArray *this,size_t neededSize)

{
  byte *pbVar1;
  ulong __size;
  
  if (this->allocatedSize_ <= neededSize) {
    __size = neededSize + 0x1ff & 0xfffffffffffffe00;
    this->allocatedSize_ = __size;
    if (this->data_ == (byte *)0x0) {
      pbVar1 = (byte *)malloc(__size);
    }
    else {
      pbVar1 = (byte *)realloc(this->data_,__size);
    }
    this->data_ = pbVar1;
  }
  return;
}

Assistant:

void ByteArray::grow(size_t neededSize)
{
	if (neededSize < allocatedSize_) return;

	// align to next 0.5kb... it's a start
	allocatedSize_ = ((neededSize+511)/512)*512;
	if (data_ == nullptr)
	{
		data_ = (byte*) malloc(allocatedSize_);
	} else {
		data_ = (byte*) realloc(data_,allocatedSize_);
	}
}